

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int m_gt_0(char *z)

{
  int iVar1;
  uint uVar2;
  char *z_00;
  char *z_01;
  
  z_00 = z + -1;
  do {
    z_00 = z_00 + 1;
    iVar1 = isVowel(z_00);
  } while (iVar1 != 0);
  if (*z_00 == '\0') {
    uVar2 = 0;
  }
  else {
    do {
      z_01 = z_00;
      iVar1 = isConsonant(z_01);
      z_00 = z_01 + 1;
    } while (iVar1 != 0);
    uVar2 = (uint)(*z_01 != '\0');
  }
  return uVar2;
}

Assistant:

static int m_gt_0(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  return *z!=0;
}